

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O2

void __thiscall
GlobOptBlockData::MergeValueMaps
          (GlobOptBlockData *this,BasicBlock *toBlock,BasicBlock *fromBlock,
          BVSparse<Memory::JitArenaAllocator> *symsRequiringCompensation,
          BVSparse<Memory::JitArenaAllocator> *symsCreatedForMerge)

{
  ushort uVar1;
  uint uVar2;
  SymID SVar3;
  Loop *pLVar4;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  Type pSVar5;
  GlobHashTable *pGVar6;
  SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *pSVar7;
  Value *pVVar8;
  Value *fromDataValue;
  BasicBlock *pBVar9;
  code *pcVar10;
  bool bVar11;
  BOOLEAN BVar12;
  undefined4 *puVar13;
  GlobOpt *pGVar14;
  Type *pTVar15;
  Type *pTVar16;
  Value **ppVVar17;
  Type *ppFVar18;
  Type pDVar19;
  BasicBlock *pBVar20;
  bool bVar21;
  undefined1 local_100 [8];
  ValueSetByValueNumber mergedValues;
  undefined1 local_80 [8];
  EditingIterator iter;
  Value *local_50;
  Value *newValue;
  Iterator iter2;
  
  pLVar4 = toBlock->loop;
  pGVar14 = this->globOpt;
  if (pLVar4 == (Loop *)0x0) {
    bVar21 = false;
  }
  else {
    bVar21 = pGVar14->prePassLoop == pLVar4;
  }
  uVar1 = *(ushort *)&toBlock->field_0x18;
  iter2.current = (NodeBase *)this;
  if (pGVar14->valuesCreatedForMerge->count != pGVar14->valuesCreatedForMerge->freeCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar13 = 1;
    bVar11 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                        ,0x2eb,"(this->globOpt->valuesCreatedForMerge->Count() == 0)",
                        "this->globOpt->valuesCreatedForMerge->Count() == 0");
    if (!bVar11) goto LAB_00463a0c;
    *puVar13 = 0;
    pGVar14 = (GlobOpt *)iter2.current[0x1a].next;
  }
  JsUtil::
  BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                    *)local_100,pGVar14->tempAlloc,0x40);
  this_00 = (BVSparse<Memory::JitArenaAllocator> *)iter2.current[0x1a].next[9].next;
  bVar11 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(this_00);
  if (!bVar11) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar13 = 1;
    bVar11 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                        ,0x2ef,"(mergedValueTypesTrackedForKills->IsEmpty())",
                        "mergedValueTypesTrackedForKills->IsEmpty()");
    if (!bVar11) {
LAB_00463a0c:
      pcVar10 = (code *)invalidInstructionException();
      (*pcVar10)();
    }
    *puVar13 = 0;
  }
  JsUtil::
  BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::Clear((BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
           *)iter2.current[0xe].next);
  pSVar5 = (iter2.current)->next;
  pGVar6 = (fromBlock->globOptData).symToValueMap;
  puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  iter.last._4_4_ = (uVar1 & 4) >> 2;
  pDVar19 = (Type)0x0;
  while (pDVar19 < (Type)(ulong)*(uint *)&pSVar5[1].next) {
    iter2.list = pGVar6->table + (long)pDVar19;
    mergedValues.
    super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    .stats = pDVar19;
    newValue = (Value *)iter2.list;
    if (iter2.list ==
        (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar13 = 1;
      bVar11 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                          ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar11) goto LAB_00463a0c;
      *puVar13 = 0;
    }
    pSVar7 = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
             ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    iter2.list = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0;
    if (pSVar7 != (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                  newValue) {
      iter2.list = pSVar7;
    }
    local_80 = (undefined1  [8])(pSVar5[2].next + (long)pDVar19 * 2);
    iter.super_Iterator.current = (NodeBase *)0x0;
    iter.super_Iterator.list =
         (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)local_80;
    while (bVar11 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                    EditingIterator::Next((EditingIterator *)local_80), bVar11) {
      pTVar15 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator::
                Data((Iterator *)local_80);
      while (((iter2.list !=
               (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0 &&
              (iter2.list !=
               (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)newValue)
              ) && (uVar2 = pTVar15->value->m_id,
                   pTVar16 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>
                             ::Iterator::Data((Iterator *)&newValue), uVar2 < pTVar16->value->m_id))
            ) {
        if (iter2.list ==
            (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar11 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                              ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar11) goto LAB_00463a0c;
          *puVar13 = 0;
        }
        pSVar7 = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                 ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        iter2.list = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0
        ;
        if (pSVar7 != (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                      newValue) {
          iter2.list = pSVar7;
        }
      }
      local_50 = (Value *)0x0;
      if ((iter2.list ==
           (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) ||
         (iter2.list ==
          (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)newValue)) {
LAB_0046375e:
        SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
        RemoveCurrent((EditingIterator *)local_80,(ArenaAllocator *)pSVar5->next);
      }
      else {
        SVar3 = pTVar15->value->m_id;
        pTVar16 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator
                  ::Data((Iterator *)&newValue);
        if (SVar3 == pTVar16->value->m_id) {
          if ((uVar1 & 4) == 0) {
            bVar11 = false;
          }
          else {
            bVar11 = false;
            if ((pLVar4 != (Loop *)0x0) &&
               (bVar11 = false, iter2.current[0x1a].next[0x1a].next == (Type)0x0)) {
              BVar12 = BVSparse<Memory::JitArenaAllocator>::Test
                                 (pLVar4->symsAssignedToInLoop,pTVar15->value->m_id);
              bVar11 = BVar12 != '\0';
            }
          }
          pVVar8 = pTVar15->element;
          pTVar16 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                    Iterator::Data((Iterator *)&newValue);
          fromDataValue = pTVar16->element;
          pTVar16 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                    Iterator::Data((Iterator *)&newValue);
          local_50 = MergeValues((GlobOptBlockData *)iter2.current,pVVar8,fromDataValue,
                                 pTVar16->value,SUB41(iter.last._4_4_,0),bVar11,
                                 symsRequiringCompensation,symsCreatedForMerge);
        }
        if (local_50 == (Value *)0x0) goto LAB_0046375e;
        iter.last._0_4_ = local_50->valueNumber;
        ppVVar17 = JsUtil::
                   BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   ::Lookup((BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                             *)local_100,(uint *)&iter.last);
        pVVar8 = *ppVVar17;
        if (pVVar8 == (Value *)0x0) {
          JsUtil::
          BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::Add((BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 *)local_100,&local_50);
        }
        else {
          BVar12 = BVSparse<Memory::JitArenaAllocator>::Test
                             ((BVSparse<Memory::JitArenaAllocator> *)
                              iter2.current[0x1a].next[1].next,local_50->valueNumber);
          if ((BVar12 == '\0') && (local_50 != pVVar8)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar13 = 1;
            bVar11 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                                ,0x326,"(newValue == previouslyMergedValue)",
                                "newValue == previouslyMergedValue");
            if (!bVar11) goto LAB_00463a0c;
            *puVar13 = 0;
          }
        }
        GlobOpt::TrackMergedValueForKills
                  ((GlobOpt *)iter2.current[0x1a].next,local_50,(GlobOptBlockData *)iter2.current,
                   this_00);
        pTVar15->element = local_50;
        if (iter2.list ==
            (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar11 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                              ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar11) goto LAB_00463a0c;
          *puVar13 = 0;
        }
        pSVar7 = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                 ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        iter2.list = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0
        ;
        if (pSVar7 != (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                      newValue) {
          iter2.list = pSVar7;
        }
      }
    }
    if ((bVar21) && (((ulong)iter2.current[0x1a].next[0x1b].next[0x2f].next & 0x80) == 0)) {
      while ((iter2.list !=
              (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0 &&
             (iter2.list !=
              (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)newValue))
            ) {
        pSVar7 = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                 ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        iter2.list = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0
        ;
        if (pSVar7 != (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                      newValue) {
          iter2.list = pSVar7;
        }
      }
    }
    pDVar19 = (Type)((long)&(mergedValues.
                             super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                            .stats)->pNext + 1);
  }
  JsUtil::
  BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Clear((BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *)iter2.current[0x1a].next[0x21].next);
  JsUtil::
  BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::Reset((BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
           *)local_100);
  BVSparse<Memory::JitArenaAllocator>::ClearAll(this_00);
  ValueHashTable<ExprHash,_Value_*>::And
            ((ValueHashTable<ExprHash,_Value_*> *)iter2.current[1].next,
             (fromBlock->globOptData).exprToValueMap);
  GlobOpt::ProcessValueKills
            ((GlobOpt *)iter2.current[0x1a].next,toBlock,(GlobOptBlockData *)iter2.current);
  if ((uVar1 & 4) == 0) {
LAB_004639ee:
    JsUtil::
    BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::~BaseDictionary((BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                       *)local_100);
    return;
  }
  GlobOpt::ProcessValueKillsForLoopHeaderAfterBackEdgeMerge
            ((GlobOpt *)iter2.current[0x1a].next,toBlock,(GlobOptBlockData *)iter2.current);
  local_80 = (undefined1  [8])&toBlock->predList;
  pBVar9 = (BasicBlock *)0x0;
  iter.super_Iterator.list =
       (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)local_80;
LAB_004638f2:
  pBVar20 = pBVar9;
  if (iter.super_Iterator.list ==
      (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar13 = 1;
    bVar21 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                        ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar21) goto LAB_00463a0c;
    *puVar13 = 0;
  }
  pSVar7 = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
           ((iter.super_Iterator.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
  if ((undefined1  [8])pSVar7 == local_80) goto LAB_004639ee;
  iter.super_Iterator.list = pSVar7;
  ppFVar18 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                       ((Iterator *)local_80);
  pBVar9 = (*ppFVar18)->predBlock;
  if (pBVar9 == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar13 = 1;
    bVar21 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                        ,0x34e,"(pred)","pred");
    if (!bVar21) goto LAB_00463a0c;
    *puVar13 = 0;
  }
  if ((pBVar20 != (BasicBlock *)0x0) && (pBVar9->number <= pBVar20->number)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar13 = 1;
    bVar21 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                        ,0x350,"(!lastBlock || pred->GetBlockNum() > lastBlock->GetBlockNum())",
                        "!lastBlock || pred->GetBlockNum() > lastBlock->GetBlockNum()");
    if (!bVar21) goto LAB_00463a0c;
    *puVar13 = 0;
  }
  goto LAB_004638f2;
}

Assistant:

void
GlobOptBlockData::MergeValueMaps(
    BasicBlock *toBlock,
    BasicBlock *fromBlock,
    BVSparse<JitArenaAllocator> *const symsRequiringCompensation,
    BVSparse<JitArenaAllocator> *const symsCreatedForMerge)
{
    GlobOptBlockData *fromData = &(fromBlock->globOptData);
    bool isLoopBackEdge = toBlock->isLoopHeader;
    Loop *loop = toBlock->loop;
    bool isLoopPrepass = (loop && this->globOpt->prePassLoop == loop);

    Assert(this->globOpt->valuesCreatedForMerge->Count() == 0);
    DebugOnly(ValueSetByValueNumber mergedValues(this->globOpt->tempAlloc, 64));

    BVSparse<JitArenaAllocator> *const mergedValueTypesTrackedForKills = this->globOpt->tempBv;
    Assert(mergedValueTypesTrackedForKills->IsEmpty());
    this->valuesToKillOnCalls->Clear(); // the tracking will be reevaluated based on merged value types

    GlobHashTable *thisTable = this->symToValueMap;
    GlobHashTable *otherTable = fromData->symToValueMap;
    for (uint i = 0; i < thisTable->tableSize; i++)
    {
        SListBase<GlobHashBucket>::Iterator iter2(&otherTable->table[i]);
        iter2.Next();
        FOREACH_SLISTBASE_ENTRY_EDITING(GlobHashBucket, bucket, &thisTable->table[i], iter)
        {
            while (iter2.IsValid() && bucket.value->m_id < iter2.Data().value->m_id)
            {
                iter2.Next();
            }
            Value *newValue = nullptr;

            if (iter2.IsValid() && bucket.value->m_id == iter2.Data().value->m_id)
            {
                // Syms that are assigned to within the loop must have unique
                // value numbers in the loop header after merging; a single
                // prepass is not adequate to determine that sym values are
                // equivalent through all possible loop paths.
                bool forceUniqueValue =
                    isLoopBackEdge &&
                    !this->globOpt->IsLoopPrePass() &&
                    loop &&
                    loop->symsAssignedToInLoop->Test(bucket.value->m_id);

                newValue =
                    this->MergeValues(
                        bucket.element,
                        iter2.Data().element,
                        iter2.Data().value,
                        isLoopBackEdge,
                        forceUniqueValue,
                        symsRequiringCompensation,
                        symsCreatedForMerge);
            }
            if (newValue == nullptr)
            {
                iter.RemoveCurrent(thisTable->alloc);
                continue;
            }
            else
            {
#if DBG
                // Ensure that only one value per value number is produced by merge. Byte-code constant values are reused in
                // multiple blocks without cloning, so exclude those value numbers.
                {
                    Value *const previouslyMergedValue = mergedValues.Lookup(newValue->GetValueNumber());
                    if (previouslyMergedValue)
                    {
                        if (!this->globOpt->byteCodeConstantValueNumbersBv->Test(newValue->GetValueNumber()))
                        {
                            Assert(newValue == previouslyMergedValue);
                        }
                    }
                    else
                    {
                        mergedValues.Add(newValue);
                    }
                }
#endif

                this->globOpt->TrackMergedValueForKills(newValue, this, mergedValueTypesTrackedForKills);
                bucket.element = newValue;
            }
            iter2.Next();
        } NEXT_SLISTBASE_ENTRY_EDITING;

        if (isLoopPrepass && !this->globOpt->rootLoopPrePass->allFieldsKilled)
        {
            while (iter2.IsValid())
            {
                iter2.Next();
            }
        }
    }

    this->globOpt->valuesCreatedForMerge->Clear();
    DebugOnly(mergedValues.Reset());
    mergedValueTypesTrackedForKills->ClearAll();

    this->exprToValueMap->And(fromData->exprToValueMap);

    this->globOpt->ProcessValueKills(toBlock, this);

    bool isLastLoopBackEdge = false;

    if (isLoopBackEdge)
    {
        this->globOpt->ProcessValueKillsForLoopHeaderAfterBackEdgeMerge(toBlock, this);

        BasicBlock *lastBlock = nullptr;
        FOREACH_PREDECESSOR_BLOCK(pred, toBlock)
        {
            Assert(!lastBlock || pred->GetBlockNum() > lastBlock->GetBlockNum());
            lastBlock = pred;
        }NEXT_PREDECESSOR_BLOCK;
        isLastLoopBackEdge = (lastBlock == fromBlock);
    }
}